

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void assert_solver_result<boost::chrono::duration<long,boost::ratio<1l,1l>>(*)(boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>const&),boost::chrono::duration<long,boost::ratio<1l,1l>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
               (_func_duration<long,_boost::ratio<1L,_1L>_>_matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_ptr
                **solving_function,
               matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
               *cost_matrix,duration<long,_boost::ratio<1L,_1L>_> expected_cost,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *expected_assignment,
               greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator)

{
  _func_duration<long,_boost::ratio<1L,_1L>_>_matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_ptr
  *p_Var1;
  ulong uVar2;
  undefined8 uVar3;
  size_t sVar4;
  bool bVar5;
  size_type sVar6;
  size_type sVar7;
  lazy_ostream *plVar8;
  reference puVar9;
  long local_280;
  basic_cstring<const_char> local_220;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_210;
  unsigned_long *local_1f0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1d8;
  equal_coll_impl local_1c9;
  assertion_result local_1c8;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_180;
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  long local_138;
  size_t expected_num_invalid_assignments;
  size_t row;
  size_t num_invalid_assignments;
  size_type local_118;
  basic_cstring<const_char> local_110;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_100;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  basic_cstring<const_char> local_b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a8;
  basic_cstring<const_char> local_80;
  basic_cstring<const_char> local_70 [2];
  rep local_50;
  duration<long,_boost::ratio<1L,_1L>_> total_cost;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment;
  greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *expected_assignment_local;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  *cost_matrix_local;
  _func_duration<long,_boost::ratio<1L,_1L>_>_matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_ptr
  **solving_function_local;
  duration<long,_boost::ratio<1L,_1L>_> expected_cost_local;
  
  solving_function_local =
       (_func_duration<long,_boost::ratio<1L,_1L>_>_matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_ptr
        **)expected_cost.rep_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&total_cost);
  p_Var1 = *solving_function;
  sVar6 = boost::numeric::ublas::
          matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
          ::size1(cost_matrix);
  sVar7 = boost::numeric::ublas::
          matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
          ::size2(cost_matrix);
  local_50 = (rep)(*p_Var1)(cost_matrix,sVar6,sVar7,
                            (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&total_cost,
                            cost_comparator);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,local_70,0x91,&local_80);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a8,plVar8,(char (*) [1])0x140372);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::chrono::duration<long,boost::ratio<1l,1l>>>
              (&local_a8,&local_b8,0x91,1,2,&local_50,"total_cost",&solving_function_local,
               "expected_cost");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a8);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_c8,0x92,&local_d8);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_100,plVar8,(char (*) [1])0x140372);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    local_118 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&total_cost);
    num_invalid_assignments =
         boost::numeric::ublas::
         matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
         ::size1(cost_matrix);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_100,&local_110,0x92,1,2,&local_118,"assignment.size()",
               &num_invalid_assignments,"cost_matrix.size1()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_100);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  row = 0;
  for (expected_num_invalid_assignments = 0; sVar4 = expected_num_invalid_assignments,
      sVar6 = boost::numeric::ublas::
              matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
              ::size1(cost_matrix), sVar4 < sVar6;
      expected_num_invalid_assignments = expected_num_invalid_assignments + 1) {
    puVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&total_cost,
                        expected_num_invalid_assignments);
    uVar2 = *puVar9;
    sVar6 = boost::numeric::ublas::
            matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
            ::size2(cost_matrix);
    if (sVar6 <= uVar2) {
      row = row + 1;
    }
  }
  sVar6 = boost::numeric::ublas::
          matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
          ::size1(cost_matrix);
  sVar7 = boost::numeric::ublas::
          matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
          ::size2(cost_matrix);
  if (sVar7 < sVar6) {
    sVar6 = boost::numeric::ublas::
            matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
            ::size1(cost_matrix);
    sVar7 = boost::numeric::ublas::
            matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
            ::size2(cost_matrix);
    local_280 = sVar6 - sVar7;
  }
  else {
    local_280 = 0;
  }
  local_138 = local_280;
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_158);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_148,0x9d,&local_158);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_180,plVar8,(char (*) [1])0x140372);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_180,&local_190,0x9d,1,2,&row,"num_invalid_assignments",&local_138,
               "expected_num_invalid_assignments");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_180);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_1a0,0x9f,&local_1b0);
    local_1d8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&total_cost);
    local_1e0._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&total_cost);
    local_1e8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(expected_assignment);
    local_1f0 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(expected_assignment)
    ;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (&local_1c8,&local_1c9,local_1d8,local_1e0,local_1e8,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_1f0);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_210,plVar8,(char (*) [1])0x140372);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_220,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,&local_210,&local_220,0x9f,1,0xd,4,"assignment.begin()","assignment.end()"
               ,"expected_assignment.begin()","expected_assignment.end()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_210);
    boost::test_tools::assertion_result::~assertion_result(&local_1c8);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&total_cost);
  return;
}

Assistant:

void assert_solver_result(const SolvingFunction& solving_function, const ublas::matrix<Cost>& cost_matrix,
                          const Cost expected_cost, const std::vector<std::size_t>& expected_assignment,
                          const CostComparator& cost_comparator)
{
  std::vector<std::size_t> assignment;
  const Cost total_cost = solving_function(cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment,
                                           cost_comparator);
  BOOST_CHECK_EQUAL(total_cost, expected_cost);
  BOOST_CHECK_EQUAL(assignment.size(), cost_matrix.size1());
  std::size_t num_invalid_assignments = 0;
  for (std::size_t row = 0; row < cost_matrix.size1(); ++row)
  {
    if (assignment.at(row) >= cost_matrix.size2())
    {
      ++num_invalid_assignments;
    }
  }
  const std::size_t expected_num_invalid_assignments = (cost_matrix.size1() > cost_matrix.size2())
                                                       ? cost_matrix.size1() - cost_matrix.size2() : 0;
  BOOST_CHECK_EQUAL(num_invalid_assignments, expected_num_invalid_assignments);
  BOOST_CHECK_EQUAL_COLLECTIONS(assignment.begin(), assignment.end(),
                                expected_assignment.begin(), expected_assignment.end());
}